

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::FragCoordWCase::iterate(FragCoordWCase *this)

{
  code *pcVar1;
  float y_00;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  TestLog *log_00;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  RenderTarget *pRVar7;
  PixelFormat *this_00;
  TestError *this_01;
  char *description;
  float fVar8;
  float local_49c;
  RGBA local_408;
  undefined1 local_404 [3];
  bool isOk;
  Vec4 color;
  Vector<float,_3> local_3e8;
  Vector<float,_3> local_3dc;
  Vector<float,_3> local_3d0;
  float local_3c4;
  float local_3c0;
  float oow;
  float yf;
  float xf;
  int x;
  int y;
  PrimitiveList local_388;
  allocator<char> local_369;
  string local_368;
  undefined1 local_348 [8];
  VertexArrayBinding posBinding;
  deUint16 indices [6];
  float positions [16];
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  ProgramSources local_228;
  undefined1 local_158 [8];
  ShaderProgram program;
  float w [4];
  undefined1 local_68 [8];
  Surface refImg;
  Surface testImg;
  RGBA local_30;
  RGBA local_2c;
  int local_28;
  RGBA threshold;
  int height;
  int width;
  Functions *gl;
  TestLog *log;
  FragCoordWCase *this_local;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar6 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  pRVar7 = gles2::Context::getRenderTarget((this->super_TestCase).m_context);
  threshold.m_value = tcu::RenderTarget::getWidth(pRVar7);
  pRVar7 = gles2::Context::getRenderTarget((this->super_TestCase).m_context);
  local_28 = tcu::RenderTarget::getHeight(pRVar7);
  tcu::RGBA::RGBA(&local_30,1,1,1,1);
  pRVar7 = gles2::Context::getRenderTarget((this->super_TestCase).m_context);
  this_00 = tcu::RenderTarget::getPixelFormat(pRVar7);
  testImg.m_pixels.m_cap._4_4_ = tcu::PixelFormat::getColorThreshold(this_00);
  local_2c = tcu::operator+(&local_30,(RGBA *)((long)&testImg.m_pixels.m_cap + 4));
  tcu::Surface::Surface((Surface *)&refImg.m_pixels.m_cap,threshold.m_value,local_28);
  tcu::Surface::Surface((Surface *)local_68,threshold.m_value,local_28);
  program.m_program.m_info.linkTimeUs = 0x400000003fd9999a;
  pRVar6 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_248,
             "attribute highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,
             "void main (void)\n{\n\tgl_FragColor = vec4(0.0, 1.0/gl_FragCoord.w - 1.0, 0.0, 1.0);\n}\n"
             ,&local_271);
  glu::makeVtxFragSources(&local_228,&local_248,&local_270);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_158,pRVar6,&local_228);
  glu::ProgramSources::~ProgramSources(&local_228);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  glu::operator<<(log_00,(ShaderProgram *)local_158);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_158);
  if (!bVar2) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"Compile failed",&local_299);
    tcu::TestError::TestError(this_01,&local_298);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  stack0xfffffffffffffd18 = 0x3fd9999abfd9999a;
  posBinding.pointer.data = (void *)0x2000200010000;
  indices[0] = 1;
  indices[1] = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"a_position",&local_369);
  glu::va::Float((VertexArrayBinding *)local_348,&local_368,4,4,0,(float *)(indices + 4));
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar3) + 0x1680);
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_158);
  (*pcVar1)(dVar4);
  pRVar6 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  dVar4 = glu::ShaderProgram::getProgram((ShaderProgram *)local_158);
  glu::pr::Triangles(&local_388,6,(deUint16 *)&posBinding.pointer.data);
  glu::draw(pRVar6,dVar4,1,(VertexArrayBinding *)local_348,&local_388,(DrawUtilCallback *)0x0);
  pRVar6 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&x,(Surface *)&refImg.m_pixels.m_cap);
  glu::readPixels(pRVar6,0,0,(PixelBufferAccess *)&x);
  dVar4 = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(dVar4,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderBuiltinVarTests.cpp"
                  ,0x1a3);
  glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_348);
  xf = 0.0;
  while( true ) {
    fVar8 = xf;
    iVar3 = tcu::Surface::getHeight((Surface *)local_68);
    if (iVar3 <= (int)fVar8) break;
    yf = 0.0;
    while( true ) {
      fVar8 = yf;
      iVar3 = tcu::Surface::getWidth((Surface *)local_68);
      if (iVar3 <= (int)fVar8) break;
      fVar8 = (float)(int)yf;
      iVar3 = tcu::Surface::getWidth((Surface *)local_68);
      oow = (fVar8 + 0.5) / (float)iVar3;
      iVar3 = tcu::Surface::getHeight((Surface *)local_68);
      iVar3 = iVar3 - (int)xf;
      iVar5 = tcu::Surface::getHeight((Surface *)local_68);
      local_3c0 = ((float)(iVar3 + -1) + 0.5) / (float)iVar5;
      if (1.0 <= oow + local_3c0) {
        tcu::Vector<float,_3>::Vector(&local_3e8,1.0,1.2,program.m_program.m_info.linkTimeUs._4_4_);
        tcu::Vector<float,_3>::Vector
                  ((Vector<float,_3> *)(color.m_data + 2),1.0,1.2,
                   program.m_program.m_info.linkTimeUs._4_4_);
        local_49c = projectedTriInterpolate
                              (&local_3e8,(Vec3 *)(color.m_data + 2),1.0 - oow,1.0 - local_3c0);
      }
      else {
        tcu::Vector<float,_3>::Vector
                  (&local_3d0,(float)program.m_program.m_info.linkTimeUs,
                   program.m_program.m_info.linkTimeUs._4_4_,1.2);
        tcu::Vector<float,_3>::Vector
                  (&local_3dc,(float)program.m_program.m_info.linkTimeUs,
                   program.m_program.m_info.linkTimeUs._4_4_,1.2);
        local_49c = projectedTriInterpolate(&local_3d0,&local_3dc,oow,local_3c0);
      }
      local_3c4 = local_49c;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_404,0.0,local_49c - 1.0,0.0,1.0);
      y_00 = xf;
      fVar8 = yf;
      tcu::RGBA::RGBA(&local_408,(Vec4 *)local_404);
      tcu::Surface::setPixel((Surface *)local_68,(int)fVar8,(int)y_00,local_408);
      yf = (float)((int)yf + 1);
    }
    xf = (float)((int)xf + 1);
  }
  bVar2 = tcu::pixelThresholdCompare
                    (log_00,"Result","Image comparison result",(Surface *)local_68,
                     (Surface *)&refImg.m_pixels.m_cap,&local_2c,COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar2 & QP_TEST_RESULT_FAIL,description);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_158);
  tcu::Surface::~Surface((Surface *)local_68);
  tcu::Surface::~Surface((Surface *)&refImg.m_pixels.m_cap);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const int				width		= m_context.getRenderTarget().getWidth();
		const int				height		= m_context.getRenderTarget().getHeight();
		const tcu::RGBA			threshold	= tcu::RGBA(1,1,1,1) + m_context.getRenderTarget().getPixelFormat().getColorThreshold();

		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		const float				w[4]		= { 1.7f, 2.0f, 1.2f, 1.0f };

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"attribute highp vec4 a_position;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"}\n",

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0, 1.0/gl_FragCoord.w - 1.0, 0.0, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			const float positions[] =
			{
				-w[0],  w[0], 0.0f, w[0],
				-w[1], -w[1], 0.0f, w[1],
				 w[2],  w[2], 0.0f, w[2],
				 w[3], -w[3], 0.0f, w[3]
			};
			const deUint16 indices[] = { 0, 1, 2, 2, 1, 3 };

			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_position", 4, 4, 0, &positions[0]);

			gl.useProgram(program.getProgram());

			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));

			glu::readPixels(m_context.getRenderContext(), 0, 0, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		for (int y = 0; y < refImg.getHeight(); y++)
		{
			for (int x = 0; x < refImg.getWidth(); x++)
			{
				const float			xf			= (float(x)+.5f) / float(refImg.getWidth());
				const float			yf			= (float(refImg.getHeight()-y-1)+.5f) / float(refImg.getHeight());
				const float			oow			= ((xf + yf) < 1.0f)
												? projectedTriInterpolate(tcu::Vec3(w[0], w[1], w[2]), tcu::Vec3(w[0], w[1], w[2]), xf, yf)
												: projectedTriInterpolate(tcu::Vec3(w[3], w[2], w[1]), tcu::Vec3(w[3], w[2], w[1]), 1.0f-xf, 1.0f-yf);
				const tcu::Vec4		color		(0.0f, oow - 1.0f, 0.0f, 1.0f);

				refImg.setPixel(x, y, tcu::RGBA(color));
			}
		}

		// Compare
		{
			bool isOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}